

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O1

size_t tinyusdz::Usd_IntegerCompression::CompressToBuffer
                 (int32_t *ints,size_t numInts,char *compressed,string *err)

{
  int iVar1;
  int *input;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  int local_84;
  char *local_80;
  string *local_78;
  int *local_70;
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  input = (int *)operator_new__(uVar6);
  if (numInts == 0) {
    sVar4 = 0;
  }
  else {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    lVar5 = 0;
    iVar1 = 0;
    uVar6 = 0;
    iVar8 = 0;
    local_80 = compressed;
    local_78 = err;
    local_70 = input;
    do {
      local_84 = *(int *)((long)ints + lVar5) - iVar1;
      pmVar2 = ::std::__detail::
               _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_84);
      uVar3 = *pmVar2 + 1;
      *pmVar2 = uVar3;
      bVar10 = uVar3 == uVar6;
      iVar9 = local_84;
      if (((uVar3 <= uVar6) && (uVar3 = uVar6, iVar9 = iVar8, bVar10)) && (iVar8 < local_84)) {
        iVar9 = local_84;
      }
      iVar1 = *(int *)((long)ints + lVar5);
      lVar5 = lVar5 + 4;
      uVar6 = uVar3;
      iVar8 = iVar9;
    } while (numInts * 4 - lVar5 != 0);
    ::std::
    _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    *local_70 = iVar9;
    sVar4 = (numInts * 2 + 7 >> 3) + 4;
    switch(numInts) {
    case 0:
      err = local_78;
      input = local_70;
      compressed = local_80;
      break;
    case 1:
      iVar1 = *ints;
      uVar6 = 0;
      if ((iVar1 != iVar9) && (uVar6 = 1, (char)iVar1 != iVar1)) {
        uVar6 = (ulong)((short)iVar1 != iVar1 | 2);
      }
      sVar4 = (*(code *)((long)&DAT_0043a5a8 + (long)(int)(&DAT_0043a5a8)[uVar6]))
                        (uVar6,(code *)((long)&DAT_0043a5a8 + (long)(int)(&DAT_0043a5a8)[uVar6]));
      return sVar4;
    case 2:
      iVar1 = *ints;
      uVar7 = 0;
      if ((iVar1 != iVar9) && (uVar7 = 1, (char)iVar1 != iVar1)) {
        uVar7 = (short)iVar1 != iVar1 | 2;
      }
      sVar4 = (*(code *)((long)&DAT_0043a598 + (long)(int)(&DAT_0043a598)[uVar7]))(0);
      return sVar4;
    case 3:
      iVar1 = *ints;
      uVar7 = 0;
      if ((iVar1 != iVar9) && (uVar7 = 1, (char)iVar1 != iVar1)) {
        uVar7 = (short)iVar1 != iVar1 | 2;
      }
      sVar4 = (*(code *)((long)&DAT_0043a5b8 + (long)(int)(&DAT_0043a5b8)[uVar7]))(0);
      return sVar4;
    default:
      iVar1 = *ints;
      uVar7 = 0;
      if ((iVar1 != iVar9) && (uVar7 = 1, (char)iVar1 != iVar1)) {
        uVar7 = (short)iVar1 != iVar1 | 2;
      }
      sVar4 = (*(code *)((long)&DAT_0043a578 + (long)(int)(&DAT_0043a578)[uVar7]))();
      return sVar4;
    }
  }
  sVar4 = LZ4Compression::CompressToBuffer((char *)input,compressed,sVar4,err);
  operator_delete__(input);
  return sVar4;
}

Assistant:

size_t
Usd_IntegerCompression::CompressToBuffer(
    int32_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}